

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numbers.cc
# Opt level: O0

bool __thiscall
absl::lts_20250127::anon_unknown_0::safe_parse_positive_int<long>
          (anon_unknown_0 *this,string_view text,int base,Nonnull<long_*> value_p)

{
  long lVar1;
  long lVar2;
  long lVar3;
  size_type sVar4;
  const_pointer pvVar5;
  const_reference pvVar6;
  undefined4 in_register_0000000c;
  long *plVar7;
  int iVar8;
  bool bVar9;
  long digit;
  uchar c;
  char *end;
  char *start;
  long vmax_over_base;
  long base_inttype;
  long vmax;
  long value;
  Nonnull<long_*> value_p_local;
  undefined1 auStack_20 [4];
  int base_local;
  string_view text_local;
  
  plVar7 = (long *)CONCAT44(in_register_0000000c,base);
  text_local._M_len = text._M_len;
  iVar8 = (int)text._M_str;
  vmax = 0;
  _auStack_20 = this;
  if (iVar8 < 0) {
    __assert_fail("base >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/numbers.cc"
                  ,0x3db,
                  "bool absl::lts_20250127::(anonymous namespace)::safe_parse_positive_int(absl::string_view, int, absl::Nonnull<IntType *>) [IntType = long]"
                 );
  }
  lVar2 = (long)iVar8;
  if (0x7fffffffffffffff < lVar2) {
    __assert_fail("vmax >= base_inttype",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/numbers.cc"
                  ,0x3dd,
                  "bool absl::lts_20250127::(anonymous namespace)::safe_parse_positive_int(absl::string_view, int, absl::Nonnull<IntType *>) [IntType = long]"
                 );
  }
  lVar1 = *(long *)(lts_20250127::(anonymous_namespace)::LookupTables<long>::kVmaxOverBase +
                   (long)iVar8 * 8);
  bVar9 = true;
  if (1 < iVar8) {
    lVar3 = std::numeric_limits<long>::max();
    bVar9 = lVar3 / lVar2 == lVar1;
  }
  if (!bVar9) {
    __assert_fail("base < 2 || std::numeric_limits<IntType>::max() / base_inttype == vmax_over_base"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/numbers.cc"
                  ,0x3e0,
                  "bool absl::lts_20250127::(anonymous namespace)::safe_parse_positive_int(absl::string_view, int, absl::Nonnull<IntType *>) [IntType = long]"
                 );
  }
  end = std::basic_string_view<char,_std::char_traits<char>_>::data
                  ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20);
  sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20);
  pvVar5 = end + sVar4;
  while( true ) {
    if (pvVar5 <= end) {
      *plVar7 = vmax;
      return true;
    }
    pvVar6 = std::array<signed_char,_256UL>::operator[]
                       ((array<signed_char,_256UL> *)
                        lts_20250127::(anonymous_namespace)::kAsciiToInt,(ulong)(byte)*end);
    lVar3 = (long)*pvVar6;
    if (lVar2 <= lVar3) {
      *plVar7 = vmax;
      return false;
    }
    if (lVar1 < vmax) {
      *plVar7 = 0x7fffffffffffffff;
      return false;
    }
    if (0x7fffffffffffffff - lVar3 < lVar2 * vmax) break;
    vmax = lVar3 + lVar2 * vmax;
    end = end + 1;
  }
  *plVar7 = 0x7fffffffffffffff;
  return false;
}

Assistant:

inline bool safe_parse_positive_int(absl::string_view text, int base,
                                    absl::Nonnull<IntType*> value_p) {
  IntType value = 0;
  const IntType vmax = std::numeric_limits<IntType>::max();
  assert(vmax > 0);
  assert(base >= 0);
  const IntType base_inttype = static_cast<IntType>(base);
  assert(vmax >= base_inttype);
  const IntType vmax_over_base = LookupTables<IntType>::kVmaxOverBase[base];
  assert(base < 2 ||
         std::numeric_limits<IntType>::max() / base_inttype == vmax_over_base);
  const char* start = text.data();
  const char* end = start + text.size();
  // loop over digits
  for (; start < end; ++start) {
    unsigned char c = static_cast<unsigned char>(start[0]);
    IntType digit = static_cast<IntType>(kAsciiToInt[c]);
    if (digit >= base_inttype) {
      *value_p = value;
      return false;
    }
    if (value > vmax_over_base) {
      *value_p = vmax;
      return false;
    }
    value *= base_inttype;
    if (value > vmax - digit) {
      *value_p = vmax;
      return false;
    }
    value += digit;
  }
  *value_p = value;
  return true;
}